

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O0

int run_tests(test **tests,int test_count)

{
  uint uVar1;
  test *test_00;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  ulong uVar8;
  undefined8 uStack_70;
  undefined4 auStack_68 [2];
  undefined8 uStack_60;
  undefined1 auStack_58 [15];
  undefined1 local_49;
  undefined1 *local_48;
  undefined8 *local_40;
  test *test;
  int i_1;
  int i;
  int passes;
  int failures;
  unsigned_long __vla_expr0;
  uint local_14;
  test **pptStack_10;
  int test_count_local;
  test **tests_local;
  
  uStack_60 = 0x1027f4;
  local_14 = test_count;
  pptStack_10 = tests;
  uVar6 = mixed_version();
  local_49 = 0;
  uStack_60 = 0x102808;
  printf("This is libmixed %s\n",uVar6);
  uStack_60 = 0x10281a;
  printf("\x1b[1;33m --> \x1b[0;0mWill run %i tests.\n",(ulong)local_14);
  _passes = (ulong)local_14;
  lVar4 = -(_passes * 8 + 0xf & 0xfffffffffffffff0);
  local_48 = auStack_58 + lVar4;
  i = 0;
  i_1 = 0;
  __vla_expr0 = (unsigned_long)auStack_58;
  for (test._4_4_ = 0; test._4_4_ < (int)local_14; test._4_4_ = test._4_4_ + 1) {
    test_00 = pptStack_10[test._4_4_];
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10286f;
    iVar5 = run_test(test_00);
    if (iVar5 == 0) {
      *(test **)(local_48 + (long)i * 8) = pptStack_10[test._4_4_];
      i = i + 1;
    }
    else {
      i_1 = i_1 + 1;
    }
  }
  uVar8 = (ulong)(uint)i_1;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1028c9;
  fprintf(_stderr,"\nPassed: %3i",uVar8);
  uVar8 = (ulong)(uint)i;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x1028e4;
  fprintf(_stderr,"\nFailed: %3i\n",uVar8);
  if (i != 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x102906;
    fprintf(_stderr,"\x1b[1;33m --> \x1b[0;0mThe following tests failed:\n");
    for (test._0_4_ = 0; (int)test < i; test._0_4_ = (int)test + 1) {
      local_40 = *(undefined8 **)(local_48 + (long)(int)test * 8);
      uVar6 = *local_40;
      uVar2 = local_40[1];
      uVar3 = local_40[2];
      uVar1 = *(uint *)(local_40 + 3);
      puVar7 = local_40 + 4;
      *(undefined4 *)((long)auStack_68 + lVar4) = *(undefined4 *)((long)local_40 + 0x1c);
      *(undefined8 **)(auStack_58 + lVar4 + -8) = puVar7;
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x102979;
      fprintf(_stderr,"%s %s %s:%i (%i):\n  %s\n",uVar6,uVar2,uVar3,(ulong)uVar1);
    }
  }
  return (int)(i == 0);
}

Assistant:

int run_tests(struct test *tests[], int test_count){
  printf("This is libmixed %s\n", mixed_version());
  printf("\033[1;33m --> \033[0;0mWill run %i tests.\n", test_count);
  struct test *failed[test_count];
  int failures = 0;
  int passes = 0;

  for(int i=0; i<test_count; ++i){
    if(run_test(tests[i])){
      ++passes;
    }else{
      failed[failures++] = tests[i];
    }
  }
  
  fprintf(stderr, "\nPassed: %3i", passes);
  fprintf(stderr, "\nFailed: %3i\n", failures);
  if(failures){
    fprintf(stderr, "\033[1;33m --> \033[0;0mThe following tests failed:\n");
    for(int i=0; i<failures; ++i){
      struct test *test = failed[i];
      fprintf(stderr, "%s %s %s:%i (%i):\n  %s\n", test->suite, test->name, test->file, test->line, test->form, test->reason);
    }
  }
  return (failures == 0);
}